

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3Runner.hpp
# Opt level: O2

void __thiscall Centaurus::Stage3Runner::thread_runner_impl(Stage3Runner *this)

{
  pointer puVar1;
  SVCapsule local_20;
  
  this->m_current_bank = -1;
  *(undefined8 *)&this->m_counter = 0;
  *(undefined8 *)((long)&this->m_current_window + 4) = 0;
  puVar1 = (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  reduce(&local_20,this);
  if ((long)this->m_current_bank != -1) {
    LOCK();
    *(undefined4 *)
     ((long)(this->super_BaseRunner).m_sub_window + (long)this->m_current_bank * 8 + 4) = 0;
    UNLOCK();
    this->m_current_bank = -1;
  }
  return;
}

Assistant:

void thread_runner_impl()
  {
    m_current_bank = -1;
    m_counter = 0;
    m_current_window = NULL;
    m_window_position = 0;
    val_stack.clear();

    reduce();

    release_bank();
  }